

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::int_writer<__int128,_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<3>_>
          *f)

{
  fill_t<wchar_t> *fill;
  size_t n;
  byte bVar1;
  size_t n_00;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_30;
  
  n = f->size_;
  n_00 = (uint)specs->width - n;
  if ((uint)specs->width < n || n_00 == 0) {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,n);
    padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                  *)f,&local_30);
  }
  else {
    fill = &specs->fill;
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (specs->fill).size_ * n_00 + n);
    bVar1 = specs->field_0x9 & 0xf;
    if (bVar1 == 3) {
      local_30 = fill<wchar_t*,wchar_t>(local_30,n_00 >> 1,fill);
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_30);
      n_00 = n_00 - (n_00 >> 1);
    }
    else {
      if (bVar1 == 2) {
        local_30 = fill<wchar_t*,wchar_t>(local_30,n_00,fill);
        padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
        ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                      *)f,&local_30);
        return;
      }
      padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
                    *)f,&local_30);
    }
    fill<wchar_t*,wchar_t>(local_30,n_00,fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }